

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

_Bool array_container_contains(array_container_t *arr,uint16_t pos)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = 0;
  uVar2 = arr->cardinality;
  do {
    while( true ) {
      if ((int)uVar2 <= (int)(uVar5 + 0x10)) {
        uVar3 = (ulong)uVar5;
        while( true ) {
          if ((long)(int)uVar2 <= (long)uVar3) {
            return false;
          }
          uVar1 = arr->array[uVar3];
          if (uVar1 == pos) break;
          uVar3 = uVar3 + 1;
          if (pos < uVar1) {
            return false;
          }
        }
        return true;
      }
      uVar6 = uVar5 + (uVar2 - 1);
      uVar4 = uVar6 >> 1;
      uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar6 & 0xfffffffe));
      if (pos <= uVar1) break;
      uVar5 = uVar4 + 1;
    }
    uVar2 = uVar4;
  } while (pos < uVar1);
  return true;
}

Assistant:

inline bool array_container_contains(const array_container_t *arr,
                                     uint16_t pos) {
    //    return binarySearch(arr->array, arr->cardinality, pos) >= 0;
    // binary search with fallback to linear search for short ranges
    int32_t low = 0;
    const uint16_t *carr = (const uint16_t *)arr->array;
    int32_t high = arr->cardinality - 1;
    //    while (high - low >= 0) {
    while (high >= low + 16) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = carr[middleIndex];
        if (middleValue < pos) {
            low = middleIndex + 1;
        } else if (middleValue > pos) {
            high = middleIndex - 1;
        } else {
            return true;
        }
    }

    for (int i = low; i <= high; i++) {
        uint16_t v = carr[i];
        if (v == pos) {
            return true;
        }
        if (v > pos) return false;
    }
    return false;
}